

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

void __thiscall SQLexer::LexLineComment(SQLexer *this)

{
  SQInteger SVar1;
  
  do {
    SVar1 = (*this->_readf)(this->_up);
    if (0xff < SVar1) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar1 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar1;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
  } while ((this->_currdata != '\n') && (this->_currdata != '\0'));
  return;
}

Assistant:

void SQLexer::LexLineComment()
{
    do { NEXT(); } while (CUR_CHAR != _SC('\n') && (!IS_EOB()));
}